

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * Extra_bddTuples(DdManager *dd,int K,DdNode *VarsN)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  int iVar4;
  
  iVar1 = dd->autoDyn;
  dd->autoDyn = 0;
  while( true ) {
    iVar4 = 0;
    iVar2 = -K;
    for (pDVar3 = VarsN; pDVar3 != dd->one; pDVar3 = (pDVar3->type).kids.T) {
      if ((pDVar3->type).kids.E != (DdNode *)((ulong)dd->one ^ 1)) {
        return (DdNode *)0x0;
      }
      iVar4 = iVar4 + 1;
      iVar2 = iVar2 + 1;
    }
    if (iVar4 < K) break;
    pDVar3 = VarsN;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    while (iVar2 != 0) {
      pDVar3 = (pDVar3->type).kids.T;
      iVar2 = iVar2 + -1;
    }
    dd->reordered = 0;
    pDVar3 = extraBddTuples(dd,pDVar3,VarsN);
    if (dd->reordered != 1) {
      dd->autoDyn = iVar1;
      return pDVar3;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Extra_bddTuples( 
  DdManager * dd,   /* the DD manager */
  int K,            /* the number of variables in tuples */
  DdNode * VarsN)   /* the set of all variables represented as a BDD */
{
    DdNode  *res;
    int     autoDyn;

    /* it is important that reordering does not happen, 
       otherwise, this methods will not work */

    autoDyn = dd->autoDyn;
    dd->autoDyn = 0;

    do {
        /* transform the numeric arguments (K) into a DdNode * argument;
         * this allows us to use the standard internal CUDD cache */
        DdNode *VarSet = VarsN, *VarsK = VarsN;
        int     nVars = 0, i;

        /* determine the number of variables in VarSet */
        while ( VarSet != b1 )
        {
            nVars++;
            /* make sure that the VarSet is a cube */
            if ( cuddE( VarSet ) != b0 )
                return NULL;
            VarSet = cuddT( VarSet );
        }
        /* make sure that the number of variables in VarSet is less or equal 
           that the number of variables that should be present in the tuples
        */
        if ( K > nVars )
            return NULL;

        /* the second argument in the recursive call stands for <n>;
         * create the first argument, which stands for <k> 
         * as when we are talking about the tuple of <k> out of <n> */
        for ( i = 0; i < nVars-K; i++ )
            VarsK = cuddT( VarsK );

        dd->reordered = 0;
        res = extraBddTuples(dd, VarsK, VarsN );

    } while (dd->reordered == 1);
    dd->autoDyn = autoDyn;
    return(res);

}